

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Quaternion QuaternionSlerp(Quaternion q1,Quaternion q2,float amount)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  Quaternion QVar14;
  
  fVar9 = q2.z;
  fVar11 = q2.w;
  fVar5 = q2.x;
  fVar7 = q2.y;
  fVar6 = q1.x;
  fVar8 = q1.y;
  fVar10 = q1.z;
  fVar12 = q1.w;
  uVar13 = q1._8_8_;
  fVar4 = fVar11 * fVar12 + fVar10 * fVar9 + fVar6 * fVar5 + fVar8 * fVar7;
  if (fVar4 < -fVar4) {
    fVar5 = -fVar5;
    fVar7 = -fVar7;
    fVar9 = -fVar9;
    fVar11 = -fVar11;
    fVar4 = -fVar4;
  }
  if (ABS(fVar4) < 1.0) {
    if (fVar4 <= 0.95) {
      fVar2 = acosf(fVar4);
      fVar4 = 1.0 - fVar4 * fVar4;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      if (0.001 <= ABS(fVar4)) {
        fVar3 = sinf((1.0 - amount) * fVar2);
        fVar3 = fVar3 / fVar4;
        fVar2 = sinf(fVar2 * amount);
        fVar2 = fVar2 / fVar4;
        fVar6 = fVar6 * fVar3 + fVar5 * fVar2;
        fVar8 = fVar8 * fVar3 + fVar7 * fVar2;
        fVar10 = fVar10 * fVar3;
        fVar12 = fVar12 * fVar3;
      }
      else {
        fVar2 = 0.5;
        fVar6 = fVar6 * 0.5 + fVar5 * 0.5;
        fVar8 = fVar8 * 0.5 + fVar7 * 0.5;
        fVar10 = fVar10 * 0.5;
        fVar12 = fVar12 * 0.5;
      }
      uVar13 = CONCAT44(fVar12 + fVar11 * fVar2,fVar10 + fVar9 * fVar2);
    }
    else {
      fVar10 = (fVar9 - fVar10) * amount + fVar10;
      fVar12 = (fVar11 - fVar12) * amount + fVar12;
      fVar6 = (fVar5 - fVar6) * amount + fVar6;
      fVar8 = (fVar7 - fVar8) * amount + fVar8;
      fVar4 = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar6 * fVar6 + fVar8 * fVar8);
      uVar1 = -(uint)(fVar4 == 0.0);
      fVar4 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar4));
      fVar6 = fVar6 * fVar4;
      fVar8 = fVar8 * fVar4;
      uVar13 = CONCAT44(fVar4 * fVar12,fVar4 * fVar10);
    }
  }
  QVar14.y = fVar8;
  QVar14.x = fVar6;
  QVar14.z = (float)(int)uVar13;
  QVar14.w = (float)(int)((ulong)uVar13 >> 0x20);
  return QVar14;
}

Assistant:

RMDEF Quaternion QuaternionSlerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

    float cosHalfTheta =  q1.x*q2.x + q1.y*q2.y + q1.z*q2.z + q1.w*q2.w;

    if (cosHalfTheta < 0)
    {
        q2.x = -q2.x; q2.y = -q2.y; q2.z = -q2.z; q2.w = -q2.w;
        cosHalfTheta = -cosHalfTheta;
    }

    if (fabs(cosHalfTheta) >= 1.0f) result = q1;
    else if (cosHalfTheta > 0.95f) result = QuaternionNlerp(q1, q2, amount);
    else
    {
        float halfTheta = acosf(cosHalfTheta);
        float sinHalfTheta = sqrtf(1.0f - cosHalfTheta*cosHalfTheta);

        if (fabs(sinHalfTheta) < 0.001f)
        {
            result.x = (q1.x*0.5f + q2.x*0.5f);
            result.y = (q1.y*0.5f + q2.y*0.5f);
            result.z = (q1.z*0.5f + q2.z*0.5f);
            result.w = (q1.w*0.5f + q2.w*0.5f);
        }
        else
        {
            float ratioA = sinf((1 - amount)*halfTheta)/sinHalfTheta;
            float ratioB = sinf(amount*halfTheta)/sinHalfTheta;

            result.x = (q1.x*ratioA + q2.x*ratioB);
            result.y = (q1.y*ratioA + q2.y*ratioB);
            result.z = (q1.z*ratioA + q2.z*ratioB);
            result.w = (q1.w*ratioA + q2.w*ratioB);
        }
    }

    return result;
}